

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O1

ConstantRange __thiscall slang::ConstantRange::intersect(ConstantRange *this,ConstantRange other)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar8 = other.left;
  uVar1 = this->left;
  uVar6 = this->right;
  uVar2 = uVar1;
  if ((int)uVar6 < (int)uVar1) {
    uVar2 = uVar6;
  }
  uVar4 = other.right;
  uVar9 = uVar4;
  if ((int)uVar4 < (int)uVar8) {
    uVar9 = uVar8;
  }
  if ((int)uVar2 <= (int)uVar9) {
    uVar3 = uVar6;
    if ((int)uVar6 < (int)uVar1) {
      uVar3 = uVar1;
    }
    uVar10 = uVar8;
    if ((int)uVar4 < (int)uVar8) {
      uVar10 = uVar4;
    }
    if ((int)uVar10 <= (int)uVar3) {
      if ((int)uVar8 <= (int)uVar4) {
        uVar4 = uVar8;
      }
      if ((int)uVar4 < (int)uVar2) {
        uVar4 = uVar2;
      }
      uVar5 = (ulong)uVar4;
      if ((int)uVar6 < (int)uVar1) {
        uVar6 = uVar1;
      }
      if ((int)uVar9 < (int)uVar6) {
        uVar6 = uVar9;
      }
      uVar7 = (ulong)uVar6 << 0x20;
      goto LAB_002beb00;
    }
  }
  uVar5 = 0;
  uVar7 = 0;
LAB_002beb00:
  return (ConstantRange)(uVar5 | uVar7);
}

Assistant:

ConstantRange ConstantRange::intersect(ConstantRange other) const {
    if (overlaps(other)) {
        ConstantRange result;
        result.left = std::max(lower(), other.lower());
        result.right = std::min(upper(), other.upper());
        return result;
    }
    return ConstantRange();
}